

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint64_t __sd;
  ostream *poVar1;
  result_type seed_00;
  bool bVar2;
  undefined1 local_b88 [8];
  RandEngine nextSeed;
  Options options;
  string local_110 [8];
  string WasmFuzzTypesOption;
  Fuzzer fuzzer;
  optional<unsigned_long> seed;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31 [8];
  bool verbose;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,"wasm-fuzz-types options",(allocator<char> *)local_b88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b88,"wasm-fuzz-types",
             (allocator<char> *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(WasmFuzzTypesOption.field_2._M_local_buf + 8),
             "Fuzz type construction, canonicalization, and operations",
             (allocator<char> *)local_58._M_pod_data);
  wasm::Options::Options
            ((Options *)&nextSeed._M_p,(string *)local_b88,
             (string *)(WasmFuzzTypesOption.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(WasmFuzzTypesOption.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b88);
  seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b88,"--seed",local_31);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(WasmFuzzTypesOption.field_2._M_local_buf + 8),"",&local_33);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,
             "Run a single workload generated by the given seed",&local_32);
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = &fuzzer.rand.features;
  local_40 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-types.cpp:629:15)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-types.cpp:629:15)>
             ::_M_manager;
  bVar2 = SUB81(&local_58,0);
  wasm::Options::add((string *)&nextSeed._M_p,(string *)local_b88,
                     (string *)(WasmFuzzTypesOption.field_2._M_local_buf + 8),
                     (string *)
                     &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged,(Arguments)local_110,
                     (function *)0x1,bVar2);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__cxx11::string::~string
            ((string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  std::__cxx11::string::~string((string *)(WasmFuzzTypesOption.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b88);
  local_31[0] = (allocator<char>)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b88,"--verbose",&local_33);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(WasmFuzzTypesOption.field_2._M_local_buf + 8),"-v",&local_32);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,"Print extra information",
             &local_34);
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-types.cpp:639:15)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-types.cpp:639:15)>
             ::_M_manager;
  local_58._M_unused._0_8_ = (undefined8)local_31;
  wasm::Options::add((string *)&nextSeed._M_p,(string *)local_b88,
                     (string *)(WasmFuzzTypesOption.field_2._M_local_buf + 8),
                     (string *)
                     &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged,(Arguments)local_110,
                     (function *)0x0,bVar2);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__cxx11::string::~string
            ((string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  std::__cxx11::string::~string((string *)(WasmFuzzTypesOption.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b88);
  wasm::Options::parse((int)&nextSeed + 0x9c0,(char **)(ulong)(uint)argc);
  wasm::Fuzzer::Fuzzer((Fuzzer *)((long)&WasmFuzzTypesOption.field_2 + 8),(bool)local_31[0]);
  if (seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ == '\x01') {
    wasm::Fuzzer::run((Fuzzer *)((long)&WasmFuzzTypesOption.field_2 + 8),fuzzer.rand._40_8_);
    wasm::Fuzzer::~Fuzzer((Fuzzer *)((long)&WasmFuzzTypesOption.field_2 + 8));
    wasm::Options::~Options((Options *)&nextSeed._M_p);
    std::__cxx11::string::~string(local_110);
    return 0;
  }
  __sd = wasm::getSeed();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
          *)local_b88,__sd);
  do {
    poVar1 = std::operator<<((ostream *)&std::cout,"Iteration ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\n");
    seed_00 = std::
              mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                            *)local_b88);
    wasm::Fuzzer::run((Fuzzer *)((long)&WasmFuzzTypesOption.field_2 + 8),seed_00);
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
  using namespace wasm;

  const std::string WasmFuzzTypesOption = "wasm-fuzz-types options";

  Options options("wasm-fuzz-types",
                  "Fuzz type construction, canonicalization, and operations");

  std::optional<uint64_t> seed;
  options.add("--seed",
              "",
              "Run a single workload generated by the given seed",
              WasmFuzzTypesOption,
              Options::Arguments::One,
              [&](Options*, const std::string& arg) {
                seed = uint64_t(std::stoull(arg));
              });

  bool verbose = false;
  options.add("--verbose",
              "-v",
              "Print extra information",
              WasmFuzzTypesOption,
              Options::Arguments::Zero,
              [&](Options*, const std::string& arg) { verbose = true; });

  options.parse(argc, argv);

  Fuzzer fuzzer{verbose};
  if (seed) {
    // Run just a single workload with the given seed.
    fuzzer.run(*seed);
  } else {
    // Continuously run workloads with new randomly generated seeds.
    size_t i = 0;
    RandEngine nextSeed(getSeed());
    while (true) {
      std::cout << "Iteration " << ++i << "\n";
      fuzzer.run(nextSeed());
    }
  }
  return 0;
}